

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall
HighsDomain::ConflictPoolPropagation::propagateConflict
          (ConflictPoolPropagation *this,HighsInt conflict)

{
  byte *pbVar1;
  pointer pHVar2;
  pointer ppVar3;
  HighsDomain *pHVar4;
  int iVar5;
  uint linkPos;
  HighsBoundType HVar6;
  pointer pWVar7;
  size_type sVar8;
  ulong uVar9;
  long lVar10;
  HighsInt HVar11;
  HighsConflictPool *pHVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  HighsDomainChange boundchg;
  array<int,_2UL> inactive;
  int local_50 [2];
  ulong local_48;
  long local_40;
  pointer local_38;
  
  local_40 = (long)conflict;
  pbVar1 = (this->conflictFlag_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start + local_40;
  *pbVar1 = *pbVar1 & 0xb;
  if (((this->conflictFlag_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start[local_40] < 2) &&
     (this->domain->infeasible_ == false)) {
    local_48 = (ulong)(uint)conflict;
    pHVar12 = this->conflictpool_;
    ppVar3 = (pHVar12->conflictRanges_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = (ulong)ppVar3[local_40].first;
    if (uVar14 == 0xffffffffffffffff) {
      unlinkWatchedLiteral(this,conflict * 2);
      unlinkWatchedLiteral(this,conflict * 2 + 1);
      return;
    }
    linkPos = conflict * 2;
    local_38 = (this->watchedLiterals_).
               super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
               ._M_impl.super__Vector_impl_data._M_start + (int)linkPos;
    lVar15 = (long)ppVar3[local_40].second - uVar14;
    lVar10 = uVar14 << 4;
    uVar13 = 0;
    while( true ) {
      uVar9 = uVar13 & 0xff;
      bVar16 = lVar15 == 0;
      lVar15 = lVar15 + -1;
      iVar5 = (int)uVar9;
      if (bVar16) break;
      bVar16 = isActive(this->domain,
                        (HighsDomainChange *)
                        ((long)&((pHVar12->conflictEntries_).
                                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->boundval + lVar10));
      if (!bVar16) {
        uVar13 = (ulong)(iVar5 + 1U);
        local_50[uVar9] = (int)uVar14;
        if ((char)(iVar5 + 1U) == '\x02') {
          (this->conflictFlag_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[local_40] = '\x02';
          goto LAB_0029f1ea;
        }
      }
      lVar10 = lVar10 + 0x10;
      uVar14 = (ulong)((int)uVar14 + 1);
    }
    (this->conflictFlag_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[local_40] = (uchar)uVar13;
    if ((uchar)uVar13 == '\x02') {
LAB_0029f1ea:
      pWVar7 = local_38;
      bVar16 = HighsDomainChange::operator!=
                         (&local_38->domchg,
                          (pHVar12->conflictEntries_).
                          super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                          _M_impl.super__Vector_impl_data._M_start + local_50[0]);
      if (bVar16) {
        unlinkWatchedLiteral(this,linkPos);
        pHVar2 = (pHVar12->conflictEntries_).
                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                 super__Vector_impl_data._M_start + local_50[0];
        HVar11 = pHVar2->column;
        HVar6 = pHVar2->boundtype;
        (pWVar7->domchg).boundval = pHVar2->boundval;
        (pWVar7->domchg).column = HVar11;
        (pWVar7->domchg).boundtype = HVar6;
        linkWatchedLiteral(this,linkPos);
      }
      bVar16 = HighsDomainChange::operator!=
                         (&pWVar7[1].domchg,
                          (pHVar12->conflictEntries_).
                          super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                          _M_impl.super__Vector_impl_data._M_start + local_50[1]);
      if (bVar16) {
        unlinkWatchedLiteral(this,linkPos | 1);
        pHVar2 = (pHVar12->conflictEntries_).
                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                 super__Vector_impl_data._M_start + local_50[1];
        HVar11 = pHVar2->column;
        HVar6 = pHVar2->boundtype;
        pWVar7[1].domchg.boundval = pHVar2->boundval;
        pWVar7[1].domchg.column = HVar11;
        pWVar7[1].domchg.boundtype = HVar6;
        linkWatchedLiteral(this,linkPos | 1);
      }
    }
    else {
      if (iVar5 == 1) {
        pHVar4 = this->domain;
        boundchg = flip(pHVar4,(pHVar12->conflictEntries_).
                               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                               ._M_impl.super__Vector_impl_data._M_start + local_50[0]);
        if (boundchg._8_8_ >> 0x20 == 0) {
          if (boundchg.boundval <=
              (pHVar4->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[boundchg.column]) {
            return;
          }
        }
        else if ((pHVar4->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[boundchg.column] <= boundchg.boundval) {
          return;
        }
        sVar8 = std::
                deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                ::size(&pHVar4->cutpoolpropagation);
        uVar14 = local_48;
        changeBound(pHVar4,boundchg,
                    (Reason)(local_48 << 0x20 | (ulong)(uint)((int)sVar8 + this->conflictpoolindex))
                   );
        pHVar12 = this->conflictpool_;
        HVar11 = (HighsInt)uVar14;
      }
      else {
        if (iVar5 != 0) {
          return;
        }
        pHVar4 = this->domain;
        pHVar4->infeasible_ = true;
        sVar8 = std::
                deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                ::size(&pHVar4->cutpoolpropagation);
        HVar11 = (HighsInt)local_48;
        this->domain->infeasible_reason =
             (Reason)((ulong)(uint)((int)sVar8 + this->conflictpoolindex) | local_48 << 0x20);
        pHVar4 = this->domain;
        pHVar4->infeasible_pos =
             (HighsInt)
             ((ulong)((long)(pHVar4->domchgstack_).
                            super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pHVar4->domchgstack_).
                           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4);
        pHVar12 = this->conflictpool_;
      }
      HighsConflictPool::resetAge(pHVar12,HVar11);
    }
  }
  return;
}

Assistant:

void HighsDomain::ConflictPoolPropagation::propagateConflict(
    HighsInt conflict) {
  // remove propagate flag, but keep watched and deleted information
  conflictFlag_[conflict] &= (3 | 8);
  // if two inactive literals are watched or conflict has been deleted skip
  if (conflictFlag_[conflict] >= 2) return;

  if (domain->infeasible_) return;

  const std::vector<HighsDomainChange>& entries =
      conflictpool_->getConflictEntryVector();
  HighsInt start = conflictpool_->getConflictRanges()[conflict].first;
  if (start == -1) {
    unlinkWatchedLiteral(2 * conflict);
    unlinkWatchedLiteral(2 * conflict + 1);
    return;
  }
  HighsInt end = conflictpool_->getConflictRanges()[conflict].second;

  WatchedLiteral* watched = watchedLiterals_.data() + 2 * conflict;

  std::array<HighsInt, 2> inactive;
  uint8_t numInactive = 0;
  for (HighsInt i = start; i != end; ++i) {
    if (domain->isActive(entries[i])) continue;

    inactive[numInactive++] = i;
    if (numInactive == 2) break;
  }

  conflictFlag_[conflict] = numInactive;

  switch (numInactive) {
    case 0:
      assert(!domain->infeasible_);
      domain->mipsolver->mipdata_->debugSolution.nodePruned(*domain);
      domain->infeasible_ = true;
      domain->infeasible_reason = Reason::cut(
          domain->cutpoolpropagation.size() + conflictpoolindex, conflict);
      domain->infeasible_pos = domain->domchgstack_.size();
      conflictpool_->resetAge(conflict);
      // printf("conflict propagation found infeasibility\n");
      break;
    case 1: {
      HighsDomainChange domchg = domain->flip(entries[inactive[0]]);
      if (!domain->isActive(domchg)) {
        domain->changeBound(
            domain->flip(entries[inactive[0]]),
            Reason::cut(domain->cutpoolpropagation.size() + conflictpoolindex,
                        conflict));
        conflictpool_->resetAge(conflict);
      }
      // printf("conflict propagation found bound change\n");
      break;
    }
    case 2: {
      if (watched[0].domchg != entries[inactive[0]]) {
        unlinkWatchedLiteral(2 * conflict);
        watched[0].domchg = entries[inactive[0]];
        linkWatchedLiteral(2 * conflict);
      }

      if (watched[1].domchg != entries[inactive[1]]) {
        unlinkWatchedLiteral(2 * conflict + 1);
        watched[1].domchg = entries[inactive[1]];
        linkWatchedLiteral(2 * conflict + 1);
      }

      return;
    }
  }
}